

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

int skynet_context_push(uint32_t handle,skynet_message *message)

{
  skynet_context *ctx_00;
  skynet_context *ctx;
  skynet_message *message_local;
  uint32_t handle_local;
  
  ctx_00 = skynet_handle_grab(handle);
  if (ctx_00 == (skynet_context *)0x0) {
    message_local._4_4_ = -1;
  }
  else {
    skynet_mq_push(ctx_00->queue,message);
    skynet_context_release(ctx_00);
    message_local._4_4_ = 0;
  }
  return message_local._4_4_;
}

Assistant:

int
skynet_context_push(uint32_t handle, struct skynet_message *message) {
	struct skynet_context * ctx = skynet_handle_grab(handle);
	if (ctx == NULL) {
		return -1;
	}
	skynet_mq_push(ctx->queue, message);
	skynet_context_release(ctx);

	return 0;
}